

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9EquivFilter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fVerbose;
  char *pcVar2;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pAbc->pGia != (Gia_Man_t *)0x0) {
      Gia_ManEquivFilter(pAbc->pGia,pAbc->vAbcObjIds,fVerbose);
      return 0;
    }
    pcVar2 = "Abc_CommandAbc9EquivFilter(): There is no AIG.\n";
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: &equiv_filter [-vh]\n");
    Abc_Print(-2,
              "\t              filters equivalence candidates after disproving some SRM outputs\n");
    Abc_Print(-2,
              "\t              (the array of disproved outputs should be given as pAbc->vAbcObjIds)\n"
             );
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v          : toggle printing verbose information [default = %s]\n",pcVar2);
    pcVar2 = "\t-h          : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandAbc9EquivFilter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManEquivFilter( Gia_Man_t * p, Vec_Int_t * vPoIds, int fVerbose );
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9EquivFilter(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManEquivFilter( pAbc->pGia, pAbc->vAbcObjIds, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv_filter [-vh]\n" );
    Abc_Print( -2, "\t              filters equivalence candidates after disproving some SRM outputs\n" );
    Abc_Print( -2, "\t              (the array of disproved outputs should be given as pAbc->vAbcObjIds)\n" );
    Abc_Print( -2, "\t-v          : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h          : print the command usage\n");
    return 1;
}